

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

void __thiscall World::~World(World *this,void **vtt)

{
  TetrominoTypeFactory *this_00;
  TetrominoFactory *this_01;
  void **vtt_local;
  World *this_local;
  
  *(void **)&this->super_Entity = *vtt;
  *(void **)(&(this->super_Entity).field_0x0 + *(long *)(*(long *)&this->super_Entity + -0x50)) =
       vtt[3];
  (this->super_Collidable)._vptr_Collidable = (_func_int **)&DAT_00157b20;
  if (this->activeTet != (Tetromino *)0x0) {
    (**(code **)(*(long *)&this->activeTet->super_Entity + 8))();
  }
  this->activeTet = (Tetromino *)0x0;
  if (this->nextTet != (Tetromino *)0x0) {
    (**(code **)(*(long *)&this->nextTet->super_Entity + 8))();
  }
  this->nextTet = (Tetromino *)0x0;
  if (this->heap != (QuadHeap *)0x0) {
    (**(code **)(*(long *)&this->heap->super_Entity + 8))();
  }
  this->heap = (QuadHeap *)0x0;
  if (this->spawnPoint != (Vec2d *)0x0) {
    operator_delete(this->spawnPoint);
  }
  this->spawnPoint = (Vec2d *)0x0;
  if (this->bounds != (Vec2d *)0x0) {
    operator_delete(this->bounds);
  }
  this->bounds = (Vec2d *)0x0;
  this_00 = this->typeFactory;
  if (this_00 != (TetrominoTypeFactory *)0x0) {
    TetrominoTypeFactory::~TetrominoTypeFactory(this_00);
    operator_delete(this_00);
  }
  this->typeFactory = (TetrominoTypeFactory *)0x0;
  this_01 = this->tetFactory;
  if (this_01 != (TetrominoFactory *)0x0) {
    TetrominoFactory::~TetrominoFactory(this_01);
    operator_delete(this_01);
  }
  this->tetFactory = (TetrominoFactory *)0x0;
  std::vector<Transformation_*,_std::allocator<Transformation_*>_>::~vector(&this->inputTransforms);
  Entity::~Entity(&this->super_Entity,vtt + 1);
  return;
}

Assistant:

World::~World() {
    delete activeTet;
    activeTet = nullptr;
    
    delete nextTet;
    nextTet = nullptr;
    
    delete heap;
    heap = nullptr;
    
    delete spawnPoint;
    spawnPoint = nullptr;
    
    delete bounds;
    bounds = nullptr;
    
    delete typeFactory;
    typeFactory = nullptr;
    
    delete tetFactory;
    tetFactory = nullptr;
}